

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Compute_Round(TT_ExecContext exc,FT_Byte round_mode)

{
  FT_Byte round_mode_local;
  TT_ExecContext exc_local;
  
  switch(round_mode) {
  case '\0':
    exc->func_round = Round_To_Half_Grid;
    break;
  case '\x01':
    exc->func_round = Round_To_Grid;
    break;
  case '\x02':
    exc->func_round = Round_To_Double_Grid;
    break;
  case '\x03':
    exc->func_round = Round_Down_To_Grid;
    break;
  case '\x04':
    exc->func_round = Round_Up_To_Grid;
    break;
  case '\x05':
    exc->func_round = Round_None;
    break;
  case '\x06':
    exc->func_round = Round_Super;
    break;
  case '\a':
    exc->func_round = Round_Super_45;
  }
  return;
}

Assistant:

static void
  Compute_Round( TT_ExecContext  exc,
                 FT_Byte         round_mode )
  {
    switch ( round_mode )
    {
    case TT_Round_Off:
      exc->func_round = (TT_Round_Func)Round_None;
      break;

    case TT_Round_To_Grid:
      exc->func_round = (TT_Round_Func)Round_To_Grid;
      break;

    case TT_Round_Up_To_Grid:
      exc->func_round = (TT_Round_Func)Round_Up_To_Grid;
      break;

    case TT_Round_Down_To_Grid:
      exc->func_round = (TT_Round_Func)Round_Down_To_Grid;
      break;

    case TT_Round_To_Half_Grid:
      exc->func_round = (TT_Round_Func)Round_To_Half_Grid;
      break;

    case TT_Round_To_Double_Grid:
      exc->func_round = (TT_Round_Func)Round_To_Double_Grid;
      break;

    case TT_Round_Super:
      exc->func_round = (TT_Round_Func)Round_Super;
      break;

    case TT_Round_Super_45:
      exc->func_round = (TT_Round_Func)Round_Super_45;
      break;
    }
  }